

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

void __thiscall
kws::Parser::ReplaceCharInFixedBuffer(Parser *this,size_t pos,size_t size,char *replacingString)

{
  pointer *pppVar1;
  iterator __position;
  pointer ppVar2;
  size_t sVar3;
  pair<unsigned_long,_unsigned_long> local_38;
  
  for (ppVar2 = (this->m_FixedPositions).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != (this->m_FixedPositions).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    if (ppVar2->first < pos) {
      pos = pos + ppVar2->second;
    }
  }
  strlen(replacingString);
  std::__cxx11::string::replace((ulong)&this->m_FixedBuffer,pos,(char *)size,(ulong)replacingString)
  ;
  sVar3 = strlen(replacingString);
  local_38.second = sVar3 - size;
  if (local_38.second != 0) {
    __position._M_current =
         (this->m_FixedPositions).
         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_FixedPositions).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_38.first = pos;
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)&this->m_FixedPositions,__position,&local_38);
    }
    else {
      (__position._M_current)->first = pos;
      (__position._M_current)->second = local_38.second;
      pppVar1 = &(this->m_FixedPositions).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
  }
  return;
}

Assistant:

void Parser::ReplaceCharInFixedBuffer(size_t pos,size_t size,const char* replacingString)
{
  std::vector<PairType>::const_iterator it = m_FixedPositions.begin();
  while(it != m_FixedPositions.end())
    {
    if((*it).first<pos)
      {
      pos += (*it).second;
      }
    it++;
    }
  m_FixedBuffer.replace(pos,size,replacingString);

  // Keep track of the current position history
  size_t sizeNewChar = strlen(replacingString);
  if(sizeNewChar != size)
    {
    PairType p;
    p.first = pos;
    p.second = sizeNewChar-size;
    m_FixedPositions.push_back(p);
    }
}